

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Capturer::~Capturer(Capturer *this)

{
  IResultCapture *pIVar1;
  bool bVar2;
  reference pvVar3;
  ulong local_18;
  size_t i;
  Capturer *this_local;
  
  bVar2 = uncaught_exceptions();
  if (!bVar2) {
    for (local_18 = 0; local_18 < this->m_captured; local_18 = local_18 + 1) {
      pIVar1 = this->m_resultCapture;
      pvVar3 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::
               operator[](&this->m_messages,local_18);
      (*pIVar1->_vptr_IResultCapture[7])(pIVar1,pvVar3);
    }
  }
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (&this->m_messages);
  return;
}

Assistant:

Capturer::~Capturer() {
        if (!uncaught_exceptions()) {
            assert(m_captured == m_messages.size());
            for (size_t i = 0; i < m_captured; ++i)
                m_resultCapture.popScopedMessage(m_messages[i]);
        }
    }